

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mdct.c
# Opt level: O3

void mdct_forward(mdct_lookup *init,float *in,float *out)

{
  float *pfVar1;
  float *pfVar2;
  long lVar3;
  ulong uVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  int iVar8;
  int *piVar9;
  long lVar10;
  float *pfVar11;
  long lVar12;
  int iVar13;
  float *pfVar14;
  ulong uVar15;
  float *pfVar16;
  uint uVar17;
  ulong uVar18;
  float *pfVar19;
  uint uVar20;
  long lVar21;
  long lVar22;
  long lVar23;
  long lVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 local_50;
  float *local_48;
  float *local_40;
  int local_34;
  
  iVar8 = init->n;
  local_50 = (long)iVar8;
  iVar13 = iVar8 >> 1;
  local_34 = iVar8 >> 2;
  uVar20 = iVar8 >> 3;
  lVar10 = -(local_50 * 4 + 0xfU & 0xfffffffffffffff0);
  lVar23 = (long)&local_58 + lVar10;
  lVar22 = (long)iVar13;
  local_58 = (long)local_34;
  pfVar14 = in + lVar22 + local_58;
  pfVar16 = init->trig;
  local_48 = pfVar16;
  local_40 = in;
  if ((int)uVar20 < 1) {
    uVar18 = 0;
  }
  else {
    pfVar14 = pfVar14 + 1;
    pfVar11 = in + local_58 + 1;
    pfVar19 = in + local_58;
    uVar18 = 0;
    lVar24 = lVar23;
    do {
      fVar25 = (float)*(undefined8 *)(pfVar16 + lVar22 + -2);
      fVar26 = (float)((ulong)*(undefined8 *)(pfVar16 + lVar22 + -2) >> 0x20);
      *(ulong *)(lVar24 + lVar22 * 4) =
           CONCAT44((pfVar19[lVar22 + -4] + pfVar14[2]) * fVar25 +
                    -(pfVar19[lVar22 + -2] + pfVar11[lVar22]) * fVar26,
                    (pfVar19[lVar22 + -4] + pfVar14[2]) * fVar26 +
                    (pfVar19[lVar22 + -2] + pfVar11[lVar22]) * fVar25);
      pfVar14 = pfVar14 + 4;
      uVar18 = uVar18 + 2;
      lVar24 = lVar24 + 8;
      pfVar16 = pfVar16 + -2;
      pfVar11 = pfVar11 + 4;
      pfVar19 = pfVar19 + -4;
    } while (uVar18 < uVar20);
    pfVar14 = pfVar19 + lVar22;
  }
  pfVar11 = local_40;
  pfVar16 = pfVar16 + lVar22;
  pfVar19 = local_40 + 1;
  uVar17 = (uint)uVar18;
  if ((int)uVar17 < (int)(iVar13 - uVar20)) {
    lVar24 = (uVar18 & 0xffffffff) * 4 + lVar22 * 4 + lVar23;
    lVar12 = 0;
    lVar21 = 0;
    do {
      fVar26 = *(float *)((long)pfVar14 + lVar12 + -8) - pfVar19[lVar21 * 2];
      fVar25 = *(float *)((long)pfVar14 + lVar12 + -0x10) - pfVar11[lVar21 * 2 + 3];
      *(float *)(lVar24 + lVar21 * 4) = pfVar16[-1] * fVar25 + pfVar16[-2] * fVar26;
      pfVar1 = pfVar16 + -1;
      pfVar2 = pfVar16 + -2;
      pfVar16 = pfVar16 + -2;
      *(float *)(lVar24 + 4 + lVar21 * 4) = fVar25 * *pfVar2 - fVar26 * *pfVar1;
      lVar3 = (uVar18 & 0xffffffff) + lVar21;
      lVar21 = lVar21 + 2;
      lVar12 = lVar12 + -0x10;
    } while (lVar3 + 2 < (long)(int)(iVar13 - uVar20));
    uVar17 = uVar17 + (int)lVar21;
    pfVar19 = (float *)((long)pfVar19 - lVar12);
  }
  pfVar11 = local_40;
  pfVar14 = local_48;
  lVar24 = local_50;
  if ((int)uVar17 < iVar13) {
    uVar18 = (ulong)uVar17;
    lVar12 = lVar22 * 4 + 4 + lVar23;
    lVar21 = -2;
    do {
      fVar25 = -pfVar11[lVar24 + lVar21] - *pfVar19;
      fVar26 = -pfVar11[lVar24 + lVar21 + -2] - pfVar19[2];
      *(float *)(lVar12 + -4 + uVar18 * 4) =
           *(float *)((long)pfVar16 + lVar21 * 2) * fVar26 +
           *(float *)((long)pfVar16 + lVar21 * 2 + -4) * fVar25;
      *(float *)(lVar12 + uVar18 * 4) =
           fVar26 * *(float *)((long)pfVar16 + lVar21 * 2 + -4) -
           fVar25 * *(float *)((long)pfVar16 + lVar21 * 2);
      pfVar19 = pfVar19 + 4;
      uVar18 = uVar18 + 2;
      lVar21 = lVar21 + -4;
    } while ((long)uVar18 < lVar22);
  }
  uVar20 = init->log2n;
  *(undefined8 *)((long)&uStack_60 + lVar10) = 0x1dbd9c;
  mdct_butterflies((mdct_lookup *)(ulong)uVar20,pfVar14,iVar13 * 4 + (int)lVar23);
  iVar8 = init->n;
  pfVar14 = init->trig;
  piVar9 = init->bitrev;
  uVar15 = (long)(iVar8 >> 1) * 4 + lVar23;
  lVar24 = 0;
  uVar18 = uVar15;
  do {
    lVar12 = (long)*(int *)((long)piVar9 + lVar24 + 4);
    fVar25 = *(float *)(uVar15 + (long)*(int *)((long)piVar9 + lVar24) * 4);
    fVar26 = *(float *)(uVar15 + 4 + (long)*(int *)((long)piVar9 + lVar24) * 4);
    fVar5 = *(float *)(uVar15 + lVar12 * 4);
    fVar6 = *(float *)(uVar15 + 4 + lVar12 * 4);
    fVar29 = fVar26 - fVar6;
    fVar27 = fVar25 + fVar5;
    fVar28 = *(float *)((long)pfVar14 + lVar24 + (long)iVar8 * 4);
    fVar7 = *(float *)((long)pfVar14 + lVar24 + (long)iVar8 * 4 + 4);
    fVar30 = fVar27 * fVar28 + fVar29 * fVar7;
    fVar28 = fVar27 * fVar7 - fVar29 * fVar28;
    fVar26 = (fVar26 + fVar6) * 0.5;
    fVar25 = (fVar25 - fVar5) * 0.5;
    uVar4 = (long)&local_48 + lVar24 + lVar10;
    *(float *)(uVar4 - 0x10) = fVar26 + fVar30;
    *(float *)(uVar18 - 8) = fVar26 - fVar30;
    *(float *)(uVar4 - 0xc) = fVar25 + fVar28;
    *(float *)(uVar18 - 4) = fVar28 - fVar25;
    lVar12 = (long)*(int *)((long)piVar9 + lVar24 + 8);
    lVar21 = (long)*(int *)((long)piVar9 + lVar24 + 0xc);
    fVar25 = *(float *)(uVar15 + lVar12 * 4);
    fVar26 = *(float *)(uVar15 + 4 + lVar12 * 4);
    fVar5 = *(float *)(uVar15 + lVar21 * 4);
    fVar6 = *(float *)(uVar15 + 4 + lVar21 * 4);
    fVar29 = fVar26 - fVar6;
    fVar27 = fVar25 + fVar5;
    fVar28 = *(float *)((long)pfVar14 + lVar24 + (long)iVar8 * 4 + 8);
    fVar7 = *(float *)((long)pfVar14 + lVar24 + (long)iVar8 * 4 + 0xc);
    fVar30 = fVar27 * fVar28 + fVar29 * fVar7;
    fVar28 = fVar27 * fVar7 - fVar29 * fVar28;
    fVar26 = (fVar26 + fVar6) * 0.5;
    fVar25 = (fVar25 - fVar5) * 0.5;
    *(float *)(uVar4 - 8) = fVar26 + fVar30;
    *(float *)(uVar18 - 0x10) = fVar26 - fVar30;
    *(float *)(uVar4 - 4) = fVar25 + fVar28;
    *(float *)(uVar18 - 0xc) = fVar28 - fVar25;
    uVar18 = uVar18 - 0x10;
    lVar24 = lVar24 + 0x10;
  } while (uVar4 < uVar18);
  if (0 < local_34) {
    lVar12 = 0;
    lVar24 = lVar22;
    do {
      lVar24 = lVar24 + -1;
      fVar25 = *(float *)(lVar23 + lVar12 * 8);
      fVar26 = *(float *)((long)&local_58 + lVar12 * 8 + lVar10 + 4);
      out[lVar12] = (pfVar14[lVar22 + lVar12 * 2] * fVar25 +
                    pfVar14[lVar22 + lVar12 * 2 + 1] * fVar26) * init->scale;
      out[lVar24] = (fVar25 * pfVar14[lVar22 + lVar12 * 2 + 1] -
                    fVar26 * pfVar14[lVar22 + lVar12 * 2]) * init->scale;
      lVar12 = lVar12 + 1;
    } while (local_58 != lVar12);
  }
  return;
}

Assistant:

void mdct_forward(mdct_lookup *init, DATA_TYPE *in, DATA_TYPE *out){
  int n=init->n;
  int n2=n>>1;
  int n4=n>>2;
  int n8=n>>3;
  DATA_TYPE *w=alloca(n*sizeof(*w)); /* forward needs working space */
  DATA_TYPE *w2=w+n2;

  /* rotate */

  /* window + rotate + step 1 */

  REG_TYPE r0;
  REG_TYPE r1;
  DATA_TYPE *x0=in+n2+n4;
  DATA_TYPE *x1=x0+1;
  DATA_TYPE *T=init->trig+n2;

  int i=0;

  for(i=0;i<n8;i+=2){
    x0 -=4;
    T-=2;
    r0= x0[2] + x1[0];
    r1= x0[0] + x1[2];
    w2[i]=   MULT_NORM(r1*T[1] + r0*T[0]);
    w2[i+1]= MULT_NORM(r1*T[0] - r0*T[1]);
    x1 +=4;
  }

  x1=in+1;

  for(;i<n2-n8;i+=2){
    T-=2;
    x0 -=4;
    r0= x0[2] - x1[0];
    r1= x0[0] - x1[2];
    w2[i]=   MULT_NORM(r1*T[1] + r0*T[0]);
    w2[i+1]= MULT_NORM(r1*T[0] - r0*T[1]);
    x1 +=4;
  }

  x0=in+n;

  for(;i<n2;i+=2){
    T-=2;
    x0 -=4;
    r0= -x0[2] - x1[0];
    r1= -x0[0] - x1[2];
    w2[i]=   MULT_NORM(r1*T[1] + r0*T[0]);
    w2[i+1]= MULT_NORM(r1*T[0] - r0*T[1]);
    x1 +=4;
  }


  mdct_butterflies(init,w+n2,n2);
  mdct_bitreverse(init,w);

  /* roatate + window */

  T=init->trig+n2;
  x0=out+n2;

  for(i=0;i<n4;i++){
    x0--;
    out[i] =MULT_NORM((w[0]*T[0]+w[1]*T[1])*init->scale);
    x0[0]  =MULT_NORM((w[0]*T[1]-w[1]*T[0])*init->scale);
    w+=2;
    T+=2;
  }
}